

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetProfiledIterations(FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  uint16 uVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  short local_30;
  uint16 newProfiledIterations_1;
  uint16 newProfiledIterations;
  uint16 clampedInterpretedCount;
  uint32 interpretedCount;
  uint16 profiledIterations;
  FunctionExecutionStateMachine *this_local;
  
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x2d9,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  clampedInterpretedCount = this->committedProfiledIterations;
  EVar3 = GetExecutionMode(this);
  if (EVar3 == ProfilingInterpreter) {
    uVar5 = GetInterpretedCount(this);
    if (uVar5 < 0x10000) {
      local_30 = (short)uVar5;
    }
    else {
      local_30 = -1;
    }
    bVar2 = (ushort)(clampedInterpretedCount + local_30) < clampedInterpretedCount;
    clampedInterpretedCount = clampedInterpretedCount + local_30;
    if (bVar2) {
      clampedInterpretedCount = 0xffff;
    }
  }
  else if ((EVar3 == SimpleJit) && ((DAT_01eafdac & 1) == 0)) {
    uVar4 = GetSimpleJitExecutedIterations(this);
    bVar2 = (ushort)(clampedInterpretedCount + uVar4) < clampedInterpretedCount;
    clampedInterpretedCount = clampedInterpretedCount + uVar4;
    if (bVar2) {
      clampedInterpretedCount = 0xffff;
    }
  }
  return clampedInterpretedCount;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetProfiledIterations() const
    {
        Assert(initializedExecutionModeAndLimits);

        uint16 profiledIterations = committedProfiledIterations;
        switch (GetExecutionMode())
        {
        case ExecutionMode::ProfilingInterpreter:
        {
            uint32 interpretedCount = GetInterpretedCount();
            const uint16 clampedInterpretedCount =
                interpretedCount <= UINT16_MAX
                ? static_cast<uint16>(interpretedCount)
                : UINT16_MAX;
            const uint16 newProfiledIterations = profiledIterations + clampedInterpretedCount;
            profiledIterations = newProfiledIterations >= profiledIterations ? newProfiledIterations : UINT16_MAX;
            break;
        }

        case ExecutionMode::SimpleJit:
            if (!CONFIG_FLAG(NewSimpleJit))
            {
                const uint16 newProfiledIterations = profiledIterations + GetSimpleJitExecutedIterations();
                profiledIterations = newProfiledIterations >= profiledIterations ? newProfiledIterations : UINT16_MAX;
            }
            break;
        }
        return profiledIterations;
    }